

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void testing::internal::UniversalTersePrinter<const_char_*>::Print(char *str,ostream *os)

{
  size_t sVar1;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  if (str != (char *)0x0) {
    local_40 = local_30;
    sVar1 = strlen(str);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,str,str + sVar1);
    PrintCharsAsStringTo<char>((char *)local_40,local_38,os);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  return;
}

Assistant:

static void Print(const char* str, ::std::ostream* os) {
    if (str == NULL) {
      *os << "NULL";
    } else {
      UniversalPrint(string(str), os);
    }
  }